

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

Expression *
slang::ast::bindCovergroupExpr
          (ExpressionSyntax *syntax,ASTContext *context,Type *lvalueType,
          bitmask<slang::ast::ASTFlags> extraFlags)

{
  undefined1 auVar1 [16];
  int iVar2;
  Expression *expr;
  undefined4 extraout_var;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffb8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_40;
  
  if (lvalueType == (Type *)0x0) {
    iVar2 = Expression::bind((int)syntax,(sockaddr *)context,(socklen_t)extraFlags.m_bits);
    expr = (Expression *)CONCAT44(extraout_var,iVar2);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = context;
    expr = Expression::bindRValue
                     ((Expression *)lvalueType,(Type *)syntax,(ExpressionSyntax *)0x0,
                      (SourceRange)(auVar1 << 0x40),(ASTContext *)extraFlags.m_bits,
                      in_stack_ffffffffffffffb8);
  }
  ASTContext::eval((ConstantValue *)&local_40,context,expr,(bitmask<slang::ast::EvalFlags>)0x8);
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_40);
  return expr;
}

Assistant:

static const Expression& bindCovergroupExpr(const ExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* lvalueType = nullptr,
                                            bitmask<ASTFlags> extraFlags = {}) {
    const Expression* expr;
    if (lvalueType)
        expr = &Expression::bindRValue(*lvalueType, syntax, {}, context, extraFlags);
    else
        expr = &Expression::bind(syntax, context, extraFlags);

    context.eval(*expr, EvalFlags::CovergroupExpr);
    return *expr;
}